

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::OneofDescriptorProto::operator==
          (OneofDescriptorProto *this,OneofDescriptorProto *other)

{
  __type_conflict4 _Var1;
  bool local_19;
  OneofDescriptorProto *other_local;
  OneofDescriptorProto *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    _Var1 = ::std::operator==(&this->name_,&other->name_);
    local_19 = false;
    if (_Var1) {
      local_19 = protozero::operator==(&this->options_,&other->options_);
    }
  }
  return local_19;
}

Assistant:

bool OneofDescriptorProto::operator==(const OneofDescriptorProto& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && options_ == other.options_;
}